

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

int set_message_correlation_id(MESSAGE_HANDLE message,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE correlation_id_value;
  int iVar3;
  char *pcVar4;
  PROPERTIES_HANDLE properties;
  PROPERTIES_HANDLE local_18;
  
  local_18 = (PROPERTIES_HANDLE)0x0;
  iVar1 = message_get_properties(message,&local_18);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xad;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xad;
    }
    pcVar4 = "Failed getting the AMQP message properties";
    iVar3 = 0xac;
LAB_0013b6e8:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"set_message_correlation_id",iVar3,1,pcVar4);
    return iVar1;
  }
  if ((local_18 == (PROPERTIES_HANDLE)0x0) &&
     (local_18 = properties_create(), local_18 == (PROPERTIES_HANDLE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xb2;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xb2;
    }
    pcVar4 = "Failed creating properties for AMQP message";
    iVar3 = 0xb1;
    goto LAB_0013b6e8;
  }
  correlation_id_value = amqpvalue_create_string(value);
  if (correlation_id_value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xbb;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"set_message_correlation_id",0xba,1,"Failed creating AMQP value for correlation-id"
               );
    }
    goto LAB_0013b832;
  }
  iVar1 = properties_set_correlation_id(local_18,correlation_id_value);
  if (iVar1 == 0) {
    iVar1 = message_set_properties(message,local_18);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 199;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed setting the AMQP message properties";
        iVar3 = 0xc6;
        goto LAB_0013b7e8;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xc2;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Failed setting the correlation id";
      iVar3 = 0xc1;
LAB_0013b7e8:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"set_message_correlation_id",iVar3,1,pcVar4);
    }
  }
  amqpvalue_destroy(correlation_id_value);
LAB_0013b832:
  properties_destroy(local_18);
  return iVar1;
}

Assistant:

static int set_message_correlation_id(MESSAGE_HANDLE message, const char* value)
{
    int result;
    PROPERTIES_HANDLE properties = NULL;

    if (message_get_properties(message, &properties) != 0)
    {
        LogError("Failed getting the AMQP message properties");
        result = MU_FAILURE;
    }
    else if (properties == NULL && (properties = properties_create()) == NULL)
    {
        LogError("Failed creating properties for AMQP message");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE amqp_value;

        if ((amqp_value = amqpvalue_create_string(value)) == NULL)
        {
            LogError("Failed creating AMQP value for correlation-id");
            result = MU_FAILURE;
        }
        else
        {
            if (properties_set_correlation_id(properties, amqp_value) != RESULT_OK)
            {
                LogError("Failed setting the correlation id");
                result = MU_FAILURE;
            }
            else if (message_set_properties(message, properties) != RESULT_OK)
            {
                LogError("Failed setting the AMQP message properties");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }

            amqpvalue_destroy(amqp_value);
        }

        properties_destroy(properties);
    }

    return result;
}